

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtHashMap.h
# Opt level: O2

int __thiscall
cbtHashMap<cbtHashPtr,_cbtCollisionObject_*>::findIndex
          (cbtHashMap<cbtHashPtr,_cbtCollisionObject_*> *this,cbtHashPtr *key)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int *piVar5;
  
  uVar1 = cbtHashPtr::getHash(key);
  uVar3 = (long)(int)uVar1 & (long)(this->m_valueArray).m_capacity - 1U;
  iVar2 = -1;
  if ((uint)uVar3 < (uint)(this->m_hashTable).m_size) {
    piVar5 = (this->m_hashTable).m_data + uVar3;
    while( true ) {
      lVar4 = (long)*piVar5;
      iVar2 = -1;
      if ((lVar4 == -1) ||
         (iVar2 = *piVar5,
         (key->field_0).m_pointer == (this->m_keyArray).m_data[lVar4].field_0.m_pointer)) break;
      piVar5 = (this->m_next).m_data + lVar4;
    }
  }
  return iVar2;
}

Assistant:

int findIndex(const Key& key) const
	{
		unsigned int hash = key.getHash() & (m_valueArray.capacity() - 1);

		if (hash >= (unsigned int)m_hashTable.size())
		{
			return BT_HASH_NULL;
		}

		int index = m_hashTable[hash];
		while ((index != BT_HASH_NULL) && key.equals(m_keyArray[index]) == false)
		{
			index = m_next[index];
		}
		return index;
	}